

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFS.hpp
# Opt level: O1

int __thiscall
webfront::fs::detail::NativeRawFS::open(NativeRawFS *this,char *__file,int __oflag,...)

{
  char cVar1;
  ifstream file;
  File local_680;
  ifstream local_428 [520];
  ifstream local_220 [520];
  
  std::ifstream::ifstream(local_428);
  http::std::filesystem::__cxx11::operator/((path *)&local_680,(path *)__file,___oflag);
  std::ifstream::open((char *)local_428,local_680.fileType);
  http::std::filesystem::__cxx11::path::~path((path *)&local_680);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    *(undefined1 *)&this[0xf].rootPath._M_pathname._M_dataplus._M_p = 0;
  }
  else {
    std::ifstream::ifstream(local_220,local_428);
    File::File(&local_680,local_220);
    http::std::_Optional_payload_base<webfront::fs::File>::_Storage<webfront::fs::File,_false>::
    _Storage<webfront::fs::File>((_Storage<webfront::fs::File,_false> *)this,&local_680);
    *(undefined1 *)&this[0xf].rootPath._M_pathname._M_dataplus._M_p = 1;
    std::ifstream::~ifstream(&local_680.fstream);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_680.encoding._M_dataplus._M_p != &local_680.encoding.field_2) {
      operator_delete(local_680.encoding._M_dataplus._M_p,
                      local_680.encoding.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::~ifstream(local_220);
  }
  std::ifstream::~ifstream(local_428);
  return (int)this;
}

Assistant:

std::optional<File> open(std::filesystem::path path) {
        std::ifstream file;
        file.open(rootPath / path, std::ios::binary);
        if (file.is_open()) return File{std::move(file)};
        return {};
    }